

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
::find_position<int>
          (dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
           *this,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  uVar4 = this->num_buckets - 1;
  uVar5 = uVar4 & (long)*key;
  iVar1 = (this->key_info).empty_key;
  iVar6 = this->table[uVar5].first;
  uVar2 = 0xffffffffffffffff;
  if (iVar1 != iVar6) {
    lVar7 = 1;
    uVar3 = uVar2;
    uVar2 = uVar5;
    do {
      if ((this->num_deleted == 0) || ((this->key_info).delkey != iVar6)) {
        if (*key == iVar6) {
          uVar5 = 0xffffffffffffffff;
          goto LAB_00a524bc;
        }
      }
      else if (uVar3 == 0xffffffffffffffff) {
        uVar3 = uVar2;
      }
      uVar2 = uVar2 + lVar7 & uVar4;
      iVar6 = this->table[uVar2].first;
      lVar7 = lVar7 + 1;
    } while (iVar1 != iVar6);
    uVar5 = uVar2;
    if (uVar3 != 0xffffffffffffffff) {
      uVar5 = uVar3;
    }
    uVar2 = 0xffffffffffffffff;
  }
LAB_00a524bc:
  pVar8.second = uVar5;
  pVar8.first = uVar2;
  return pVar8;
}

Assistant:

size_type bucket_count() const { return num_buckets; }